

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_connect(Curl_easy *data,_Bool *done)

{
  connectdata *conn;
  char *pcVar1;
  char *pcVar2;
  CURLcode CVar3;
  
  if ((data->state).aptr.user == (char *)0x0) {
    CVar3 = CURLE_LOGIN_DENIED;
  }
  else {
    conn = data->conn;
    (conn->proto).smbc.state = SMB_CONNECTING;
    pcVar1 = (char *)(*Curl_cmalloc)(0x9000);
    (conn->proto).smbc.recv_buf = pcVar1;
    CVar3 = CURLE_OUT_OF_MEMORY;
    if (pcVar1 != (char *)0x0) {
      Curl_conncontrol(conn,0);
      pcVar1 = conn->user;
      pcVar2 = strchr(pcVar1,0x2f);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strchr(pcVar1,0x5c);
      }
      if (pcVar2 == (char *)0x0) {
        (conn->proto).smbc.user = pcVar1;
        pcVar1 = (*Curl_cstrdup)((conn->host).name);
        (conn->proto).smbc.domain = pcVar1;
        if (pcVar1 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        (conn->proto).smbc.user = pcVar2 + 1;
        pcVar1 = (*Curl_cstrdup)(pcVar1);
        (conn->proto).smbc.domain = pcVar1;
        if (pcVar1 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        pcVar2[(long)pcVar1 - (long)conn->user] = '\0';
      }
      CVar3 = CURLE_OK;
    }
  }
  return CVar3;
}

Assistant:

static CURLcode smb_connect(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  char *slash;

  (void) done;

  /* Check we have a username and password to authenticate with */
  if(!data->state.aptr.user)
    return CURLE_LOGIN_DENIED;

  /* Initialize the connection state */
  smbc->state = SMB_CONNECTING;
  smbc->recv_buf = malloc(MAX_MESSAGE_SIZE);
  if(!smbc->recv_buf)
    return CURLE_OUT_OF_MEMORY;

  /* Multiple requests are allowed with this connection */
  connkeep(conn, "SMB default");

  /* Parse the username, domain, and password */
  slash = strchr(conn->user, '/');
  if(!slash)
    slash = strchr(conn->user, '\\');

  if(slash) {
    smbc->user = slash + 1;
    smbc->domain = strdup(conn->user);
    if(!smbc->domain)
      return CURLE_OUT_OF_MEMORY;
    smbc->domain[slash - conn->user] = 0;
  }
  else {
    smbc->user = conn->user;
    smbc->domain = strdup(conn->host.name);
    if(!smbc->domain)
      return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}